

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5ExprClearPoslists(Fts5ExprNode *pNode)

{
  int local_14;
  int i;
  Fts5ExprNode *pNode_local;
  
  if ((pNode->eType == 4) || (pNode->eType == 9)) {
    (pNode->pNear->apPhrase[0]->poslist).n = 0;
  }
  else {
    for (local_14 = 0; local_14 < pNode->nChild; local_14 = local_14 + 1) {
      fts5ExprClearPoslists(pNode->apChild[local_14]);
    }
  }
  return;
}

Assistant:

static void fts5ExprClearPoslists(Fts5ExprNode *pNode){
  if( pNode->eType==FTS5_TERM || pNode->eType==FTS5_STRING ){
    pNode->pNear->apPhrase[0]->poslist.n = 0;
  }else{
    int i;
    for(i=0; i<pNode->nChild; i++){
      fts5ExprClearPoslists(pNode->apChild[i]);
    }
  }
}